

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O3

void __thiscall
NativeCodeGenerator::FreeLoopBodyJobManager::QueueFreeLoopBodyJob
          (FreeLoopBodyJobManager *this,void *codeAddress,void *thunkAddress)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HeapAllocator *this_00;
  FreeLoopBodyJob *holder;
  JobProcessor *pJVar4;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (this->isClosed == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                       ,0xd45,"(!this->isClosed)","!this->isClosed");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_58 = (undefined1  [8])&FreeLoopBodyJob::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_1bf09e9;
  data.filename._0_4_ = 0xd47;
  this_00 = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_58);
  holder = (FreeLoopBodyJob *)Memory::HeapAllocator::AllocT<true>(this_00,0x38);
  JsUtil::Job::Job((Job *)holder,(JobManager *)this,false);
  holder->heapAllocated = true;
  holder->codeAddress = codeAddress;
  holder->thunkAddress = thunkAddress;
  pJVar4 = JsUtil::JobManager::Processor((JobManager *)this);
  local_58 = (undefined1  [8])JsUtil::JobProcessor::GetCriticalSection(pJVar4);
  if (local_58 != (undefined1  [8])0x0) {
    CCLock::Enter((CCLock *)local_58);
  }
  pJVar4 = JsUtil::JobManager::Processor((JobManager *)this);
  bVar2 = JsUtil::JobProcessor::HasManager(pJVar4,(JobManager *)this);
  if (bVar2) {
    pJVar4 = JsUtil::JobManager::Processor((JobManager *)this);
    JsUtil::JobProcessor::
    AddJobAndProcessProactively<NativeCodeGenerator::FreeLoopBodyJobManager,NativeCodeGenerator::FreeLoopBodyJob*>
              (pJVar4,this,holder);
  }
  else {
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,holder,0x38);
  }
  AutoOptionalCriticalSection::~AutoOptionalCriticalSection((AutoOptionalCriticalSection *)local_58)
  ;
  return;
}

Assistant:

void NativeCodeGenerator::FreeLoopBodyJobManager::QueueFreeLoopBodyJob(void* codeAddress, void * thunkAddress)
{
    Assert(!this->isClosed);

    FreeLoopBodyJob* job = HeapNewNoThrow(FreeLoopBodyJob, this, codeAddress, thunkAddress);

    if (job == nullptr)
    {
        FreeLoopBodyJob stackJob(this, codeAddress, thunkAddress, false /* heapAllocated */);

        {
            AutoOptionalCriticalSection lock(Processor()->GetCriticalSection());
#if DBG
            this->waitingForStackJob = true;
#endif
            this->stackJobProcessed = false;
            Processor()->AddJob(&stackJob);
        }
        Processor()->PrioritizeJobAndWait(this, &stackJob);
    }
    else
    {
        AutoOptionalCriticalSection lock(Processor()->GetCriticalSection());
        if (Processor()->HasManager(this))
        {
            Processor()->AddJobAndProcessProactively<FreeLoopBodyJobManager, FreeLoopBodyJob*>(this, job);
        }
        else
        {
            HeapDelete(job);
        }
    }
}